

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O0

void Pf_StoPrint(Pf_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int Int;
  Pf_Mat_t Mat;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *vArr;
  int Count;
  int Entry;
  int GateId;
  int i;
  int t;
  int fVerbose_local;
  Pf_Man_t *p_local;
  
  vArr._0_4_ = 0;
  for (GateId = 2; iVar2 = Vec_WecSize(p->vTt2Match), GateId < iVar2; GateId = GateId + 1) {
    p_00 = Vec_WecEntry(p->vTt2Match,GateId);
    for (Entry = 0; iVar2 = Vec_IntSize(p_00), Entry + 1 < iVar2; Entry = Entry + 2) {
      iVar2 = Vec_IntEntry(p_00,Entry);
      Int = Vec_IntEntry(p_00,Entry + 1);
      vArr._0_4_ = (uint)vArr + 1;
      if ((fVerbose != 0) && (GateId < 10)) {
        Mat = Pf_Int2Mat(Int);
        Pf_StoPrintOne(p,(uint)vArr,GateId,Entry / 2,iVar2,Mat);
      }
    }
  }
  uVar1 = p->nCells;
  uVar3 = Vec_MemEntryNum(p->vTtMem);
  printf("Gates = %d.  Truths = %d.  Matches = %d.\n",(ulong)uVar1,(ulong)uVar3,(ulong)(uint)vArr);
  return;
}

Assistant:

void Pf_StoPrint( Pf_Man_t * p, int fVerbose )
{
    int t, i, GateId, Entry, Count = 0;
    for ( t = 2; t < Vec_WecSize(p->vTt2Match); t++ )
    {
        Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, t );
        Vec_IntForEachEntryDouble( vArr, GateId, Entry, i )
        {
            Count++;
            if ( !fVerbose )
                continue;
            if ( t < 10 )
                Pf_StoPrintOne( p, Count, t, i/2, GateId, Pf_Int2Mat(Entry) );
        }
    }
    printf( "Gates = %d.  Truths = %d.  Matches = %d.\n", 
        p->nCells, Vec_MemEntryNum(p->vTtMem), Count );
}